

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemRecord.cpp
# Opt level: O3

void * operator_new__(size_t nSize,char *fileName,int lineName)

{
  void *ptr;
  MemRecordMap *this;
  allocator local_49;
  string local_48;
  
  ptr = malloc(nSize);
  this = MemRecordMap::getInstance();
  std::__cxx11::string::string((string *)&local_48,fileName,&local_49);
  MemRecordMap::insertMap(this,ptr,&local_48,lineName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"call new[]",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return ptr;
}

Assistant:

void* operator new[](size_t nSize , char* fileName , int lineName){
    void* ptr = malloc(nSize);
    MemRecordMap::getInstance()->insertMap(ptr,fileName,lineName);
    std::cout<<"call new[]"<<std::endl;
    return ptr;
}